

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dangical.cpp
# Opt level: O3

int __thiscall
icu_63::DangiCalendar::clone
          (DangiCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ChineseCalendar *this_00;
  
  this_00 = (ChineseCalendar *)UMemory::operator_new((UMemory *)0x270,(size_t)__fn);
  if (this_00 != (ChineseCalendar *)0x0) {
    ChineseCalendar::ChineseCalendar(this_00,&this->super_ChineseCalendar);
    (this_00->super_Calendar).super_UObject._vptr_UObject =
         (_func_int **)&PTR__DangiCalendar_003a2a28;
  }
  return (int)this_00;
}

Assistant:

Calendar*
DangiCalendar::clone() const
{
    return new DangiCalendar(*this);
}